

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

size_t __thiscall CoreML::Specification::SplitNDLayerParams::ByteSizeLong(SplitNDLayerParams *this)

{
  int iVar1;
  long lVar2;
  unsigned_long *puVar3;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  int index;
  
  iVar1 = (this->splitsizes_).current_size_;
  index = 0;
  if (iVar1 < 1) {
    lVar7 = 0;
  }
  else {
    lVar7 = 0;
    do {
      puVar3 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->splitsizes_,index);
      lVar2 = 0x3f;
      if ((*puVar3 | 1) != 0) {
        for (; (*puVar3 | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      lVar7 = lVar7 + (ulong)((int)lVar2 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (iVar1 != index);
  }
  uVar6 = (uint)lVar7;
  if (lVar7 == 0) {
    uVar5 = 0;
  }
  else if ((int)uVar6 < 0) {
    uVar5 = 0xb;
  }
  else {
    iVar1 = 0x1f;
    if ((uVar6 | 1) != 0) {
      for (; (uVar6 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    uVar5 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
  }
  this->_splitsizes_cached_byte_size_ = uVar6;
  sVar4 = uVar5 + lVar7;
  if (this->axis_ != 0) {
    uVar5 = this->axis_ | 1;
    lVar7 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    sVar4 = sVar4 + ((int)lVar7 * 9 + 0x49U >> 6) + 1;
  }
  if (this->numsplits_ != 0) {
    uVar5 = this->numsplits_ | 1;
    lVar7 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    sVar4 = sVar4 + ((int)lVar7 * 9 + 0x49U >> 6) + 1;
  }
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

size_t SplitNDLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.SplitNDLayerParams)
  size_t total_size = 0;

  // repeated uint64 splitSizes = 3;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->splitsizes_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _splitsizes_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // int64 axis = 1;
  if (this->axis() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int64Size(
        this->axis());
  }

  // uint64 numSplits = 2;
  if (this->numsplits() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->numsplits());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}